

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Descriptor * __thiscall google::protobuf::FieldDescriptor::message_type(FieldDescriptor *this)

{
  Descriptor *pDVar1;
  FieldDescriptor *local_10;
  
  if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
    local_10 = this;
    std::
    call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x18),TypeOnceInit,&local_10);
  }
  if (((byte)this[2] & 0xfe) == 10) {
    pDVar1 = *(Descriptor **)(this + 0x30);
  }
  else {
    pDVar1 = (Descriptor *)0x0;
  }
  return pDVar1;
}

Assistant:

const Descriptor* FieldDescriptor::message_type() const {
  if (type_once_) {
    internal::call_once(*type_once_, FieldDescriptor::TypeOnceInit, this);
  }
  return type_ == TYPE_MESSAGE || type_ == TYPE_GROUP
             ? type_descriptor_.message_type
             : nullptr;
}